

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

Box2i __thiscall
Imf_3_4::DeepTiledInputFile::dataWindowForTile(DeepTiledInputFile *this,int dx,int dy,int lx,int ly)

{
  bool bVar1;
  int iVar2;
  ArgExc *pAVar3;
  exr_context_t p_Var4;
  element_type *peVar5;
  Vec2<int> *minT;
  Vec2<int> *maxT;
  int in_ECX;
  int in_EDX;
  Vec2<int> extraout_RDX;
  Vec2<int> in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  Box2i BVar6;
  stringstream _iex_replace_s;
  BaseExc *e;
  int limY;
  int limX;
  int32_t tileSizeY;
  int32_t tileSizeX;
  Box2i dw;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  int in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  DeepTiledInputFile *in_stack_fffffffffffffdc8;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  DeepTiledInputFile *in_stack_ffffffffffffff98;
  Vec2<int> local_5c;
  Vec2<int> local_54;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30 [4];
  undefined4 local_20;
  undefined4 local_1c;
  int local_18;
  int local_14;
  
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  bVar1 = isValidTile(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0,
                      in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8);
  if (!bVar1) {
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar3,"Arguments not in valid range.");
    __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  dataWindowForLevel(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
  p_Var4 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x1b9b49);
  peVar5 = std::
           __shared_ptr_access<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b9b5c);
  iVar2 = exr_get_tile_sizes(p_Var4,peVar5->partNumber,local_1c,local_20,&local_40,&local_44);
  if (iVar2 != 0) {
    pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar3,"Unable to query the data window.");
    __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  local_3c = local_3c + local_14 * local_40;
  local_38 = local_38 + local_18 * local_44;
  local_48 = local_3c + -1 + local_40;
  local_4c = local_38 + -1 + local_44;
  minT = (Vec2<int> *)std::min<int>(&local_48,&local_34);
  local_48 = minT->x;
  maxT = (Vec2<int> *)std::min<int>(&local_4c,local_30);
  local_4c = maxT->x;
  Imath_3_2::Vec2<int>::Vec2(&local_54,local_3c,local_38);
  Imath_3_2::Vec2<int>::Vec2(&local_5c,local_48,local_4c);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(in_stack_fffffffffffffdb0,minT,maxT);
  BVar6.max = extraout_RDX;
  BVar6.min = in_RDI;
  return BVar6;
}

Assistant:

IMATH_NAMESPACE::Box2i
DeepTiledInputFile::dataWindowForTile (int dx, int dy, int lx, int ly) const
{
    try
    {
        if (!isValidTile (dx, dy, lx, ly))
            throw IEX_NAMESPACE::ArgExc ("Arguments not in valid range.");

        //exr_attr_box2i_t dw = _ctxt.dataWindow (_data->partNumber);
        auto dw = dataWindowForLevel (lx, ly);

        int32_t tileSizeX, tileSizeY;
        if (EXR_ERR_SUCCESS !=
            exr_get_tile_sizes (_ctxt, _data->partNumber, lx, ly, &tileSizeX, &tileSizeY))
          throw IEX_NAMESPACE::ArgExc ("Unable to query the data window.");

        dw.min.x += dx * tileSizeX;
        dw.min.y += dy * tileSizeY;
        int limX = dw.min.x + tileSizeX - 1;
        int limY = dw.min.y + tileSizeY - 1;
        limX = std::min (limX, dw.max.x);
        limY = std::min (limY, dw.max.y);

        return IMATH_NAMESPACE::Box2i (
            IMATH_NAMESPACE::V2i (dw.min.x, dw.min.y),
            IMATH_NAMESPACE::V2i (limX, limY));
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error calling dataWindowForTile() on image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}